

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Iterator.h
# Opt level: O1

uint8_t * __thiscall arangodb::velocypack::ArrayIterator::first(ArrayIterator *this)

{
  bool bVar1;
  ulong uVar2;
  ValueLength VVar3;
  byte bVar4;
  long lVar5;
  byte *pbVar6;
  byte *pbVar7;
  
  if (this->_size == 0) {
    pbVar7 = (byte *)0x0;
  }
  else {
    pbVar7 = (this->_slice)._start;
    if (*pbVar7 == 0x13) {
      uVar2 = 0;
      bVar4 = 0;
      pbVar6 = pbVar7;
      do {
        pbVar6 = pbVar6 + 1;
        uVar2 = uVar2 + ((ulong)(*pbVar6 & 0x7f) << (bVar4 & 0x3f));
        bVar4 = bVar4 + 7;
      } while ((char)*pbVar6 < '\0');
      lVar5 = 2;
      if (0x7f < uVar2) {
        do {
          lVar5 = lVar5 + 1;
          bVar1 = 0x3fff < uVar2;
          uVar2 = uVar2 >> 7;
        } while (bVar1);
      }
      pbVar7 = pbVar7 + lVar5;
    }
    else {
      VVar3 = SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::findDataOffset
                        ((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *)this
                         ,*pbVar7);
      pbVar7 = pbVar7 + VVar3;
    }
  }
  return pbVar7;
}

Assistant:

[[nodiscard]] uint8_t const* first() const noexcept {
    if (VELOCYPACK_UNLIKELY(_size == 0)) {
      return nullptr;
    }
    auto const head = _slice.head();
    VELOCYPACK_ASSERT(head != 0x01);  // no empty array allowed here
    if (head == 0x13) {
      return _slice.start() + _slice.getStartOffsetFromCompact();
    }
    return _slice.begin() + _slice.findDataOffset(head);
  }